

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O3

void __thiscall
boost::runtime::basic_param::help(basic_param *this,ostream *ostr,cstring *negation_prefix_)

{
  ostream *poVar1;
  char local_39;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  local_38 = *(undefined4 *)&negation_prefix_->m_begin;
  uStack_34 = *(undefined4 *)((long)&negation_prefix_->m_begin + 4);
  uStack_30 = *(undefined4 *)&negation_prefix_->m_end;
  uStack_2c = *(undefined4 *)((long)&negation_prefix_->m_end + 4);
  (*this->_vptr_basic_param[5])();
  if ((this->p_help)._M_string_length != 0) {
    local_39 = '\n';
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(ostr,&local_39,1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(this->p_help)._M_dataplus._M_p,(this->p_help)._M_string_length);
    local_39 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_39,1);
  }
  return;
}

Assistant:

virtual void            help( std::ostream& ostr, cstring negation_prefix_ )
    {
        usage( ostr, negation_prefix_ );

        if( !p_help.empty() )
            ostr << '\n' << p_help << '\n';
    }